

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O3

void __thiscall
duckdb::Deserializer::
ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::Complex,std::default_delete<duckdb::Complex>,true>>
          (Deserializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::Complex,_std::default_delete<duckdb::Complex>,_true> *ret)

{
  pointer pcVar1;
  _Head_base<0UL,_duckdb::Complex_*,_false> _Var2;
  pointer pCVar3;
  int iVar4;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::Complex_*,_false> local_28;
  pointer local_20;
  
  iVar4 = (*this->_vptr_Deserializer[4])();
  if ((char)iVar4 != '\0') {
    local_28._M_head_impl = (pointer)0x0;
    iVar4 = (*this->_vptr_Deserializer[10])(this);
    if ((char)iVar4 != '\0') {
      (*this->_vptr_Deserializer[6])(this);
      Complex::Deserialize((Complex *)&local_20,this);
      pCVar3 = local_20;
      local_20 = (pointer)0x0;
      std::__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>::reset
                ((__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_> *)
                 &local_28,pCVar3);
      pCVar3 = local_20;
      if (local_20 != (pointer)0x0) {
        pcVar1 = (local_20->c2)._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar1 != &(local_20->c2).field_2) {
          operator_delete(pcVar1);
        }
        operator_delete(pCVar3);
      }
      (*this->_vptr_Deserializer[7])(this);
    }
    (*this->_vptr_Deserializer[0xb])(this);
    _Var2._M_head_impl = local_28._M_head_impl;
    local_28._M_head_impl = (Complex *)0x0;
    std::__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>::reset
              ((__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_> *)ret,
               _Var2._M_head_impl);
    _Var2._M_head_impl = local_28._M_head_impl;
    if (local_28._M_head_impl != (Complex *)0x0) {
      pcVar1 = ((local_28._M_head_impl)->c2)._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)pcVar1 != &((local_28._M_head_impl)->c2).field_2) {
        operator_delete(pcVar1);
      }
      operator_delete(_Var2._M_head_impl);
    }
    (*this->_vptr_Deserializer[5])(this,1);
    return;
  }
  std::__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_>::reset
            ((__uniq_ptr_impl<duckdb::Complex,_std::default_delete<duckdb::Complex>_> *)ret,
             (pointer)0x0);
  (*this->_vptr_Deserializer[5])(this,0);
  return;
}

Assistant:

inline void ReadPropertyWithDefault(const field_id_t field_id, const char *tag, T &ret) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			ret = std::forward<T>(SerializationDefaultValue::GetDefault<T>());
			OnOptionalPropertyEnd(false);
			return;
		}
		ret = Read<T>();
		OnOptionalPropertyEnd(true);
	}